

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQChar * IdType2Name(SQObjectType type)

{
  SQObjectType SVar1;
  SQObjectType type_local;
  char *local_8;
  
  SVar1 = type & 0xffffff;
  if (SVar1 == 1) {
    local_8 = "null";
  }
  else if (SVar1 == 2) {
    local_8 = "integer";
  }
  else if (SVar1 == 4) {
    local_8 = "float";
  }
  else if (SVar1 == 8) {
    local_8 = "bool";
  }
  else if (SVar1 == 0x10) {
    local_8 = "string";
  }
  else if (SVar1 == 0x20) {
    local_8 = "table";
  }
  else if (SVar1 == 0x40) {
    local_8 = "array";
  }
  else {
    if (SVar1 != 0x80) {
      if ((SVar1 == 0x100) || (SVar1 == 0x200)) {
        return "function";
      }
      if (SVar1 == 0x400) {
        return "generator";
      }
      if (SVar1 != OT_USERPOINTER) {
        if (SVar1 == 0x1000) {
          return "thread";
        }
        if (SVar1 == 0x2000) {
          return "function";
        }
        if (SVar1 == 0x4000) {
          return "class";
        }
        if (SVar1 != 0x8000) {
          if (SVar1 == 0x10000) {
            return "weakref";
          }
          if (SVar1 != 0x20000) {
            return (SQChar *)0x0;
          }
          return "outer";
        }
        return "instance";
      }
    }
    local_8 = "userdata";
  }
  return local_8;
}

Assistant:

const SQChar *IdType2Name(SQObjectType type)
{
    switch(_RAW_TYPE(type))
    {
    case _RT_NULL:return _SC("null");
    case _RT_INTEGER:return _SC("integer");
    case _RT_FLOAT:return _SC("float");
    case _RT_BOOL:return _SC("bool");
    case _RT_STRING:return _SC("string");
    case _RT_TABLE:return _SC("table");
    case _RT_ARRAY:return _SC("array");
    case _RT_GENERATOR:return _SC("generator");
    case _RT_CLOSURE:
    case _RT_NATIVECLOSURE:
        return _SC("function");
    case _RT_USERDATA:
    case _RT_USERPOINTER:
        return _SC("userdata");
    case _RT_THREAD: return _SC("thread");
    case _RT_FUNCPROTO: return _SC("function");
    case _RT_CLASS: return _SC("class");
    case _RT_INSTANCE: return _SC("instance");
    case _RT_WEAKREF: return _SC("weakref");
    case _RT_OUTER: return _SC("outer");
    default:
        return NULL;
    }
}